

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O2

int quicly_remote_cid_register
              (quicly_remote_cid_set_t *set,uint64_t sequence,uint8_t *cid,size_t cid_len,
              uint8_t *srt,uint64_t retire_prior_to,uint64_t *unregistered_seqs,
              size_t *num_unregistered_seqs)

{
  uint8_t *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ulong uVar27;
  bool bVar28;
  int iVar29;
  size_t sVar30;
  ulong uVar31;
  long lVar32;
  size_t sVar33;
  size_t idx_to_unreg;
  size_t sVar34;
  uint64_t *puVar35;
  quicly_remote_cid_t backup_cid;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined8 uVar13;
  undefined1 uVar14;
  undefined7 uVar15;
  undefined1 uVar16;
  undefined6 uVar17;
  undefined1 uVar18;
  undefined5 uVar19;
  undefined1 uVar20;
  undefined4 uVar21;
  undefined1 uVar22;
  undefined3 uVar23;
  undefined1 uVar24;
  undefined2 uVar25;
  undefined1 uVar26;
  
  auVar2._0_4_ = set->cids[0].is_active;
  auVar2._4_4_ = *(undefined4 *)&set->cids[0].field_0x4;
  auVar2._8_8_ = set->cids[0].sequence;
  uVar4 = set->cids[0].cid.cid[0];
  uVar5 = set->cids[0].cid.cid[1];
  uVar6 = set->cids[0].cid.cid[2];
  uVar7 = set->cids[0].cid.cid[3];
  uVar8 = set->cids[0].cid.cid[4];
  uVar9 = set->cids[0].cid.cid[5];
  uVar10 = set->cids[0].cid.cid[6];
  uVar11 = set->cids[0].cid.cid[7];
  uVar12 = set->cids[0].cid.cid[8];
  uVar14 = set->cids[0].cid.cid[9];
  uVar16 = set->cids[0].cid.cid[10];
  uVar18 = set->cids[0].cid.cid[0xb];
  uVar20 = set->cids[0].cid.cid[0xc];
  uVar22 = set->cids[0].cid.cid[0xd];
  uVar24 = set->cids[0].cid.cid[0xe];
  uVar26 = set->cids[0].cid.cid[0xf];
  uVar25 = CONCAT11(uVar26,uVar24);
  uVar23 = CONCAT21(uVar25,uVar22);
  uVar21 = CONCAT31(uVar23,uVar20);
  uVar19 = CONCAT41(uVar21,uVar18);
  uVar17 = CONCAT51(uVar19,uVar16);
  uVar15 = CONCAT61(uVar17,uVar14);
  uVar13 = CONCAT71(uVar15,uVar12);
  auVar2._24_8_ = uVar13;
  auVar2[0x17] = uVar11;
  auVar2[0x16] = uVar10;
  auVar2[0x15] = uVar9;
  auVar2[0x14] = uVar8;
  auVar2[0x13] = uVar7;
  auVar2[0x12] = uVar6;
  auVar2[0x11] = uVar5;
  auVar2[0x10] = uVar4;
  auVar3 = *(undefined1 (*) [32])(set->cids[0].cid.cid + 8);
  backup_cid._32_8_ = auVar3._8_8_;
  backup_cid.stateless_reset_token._3_8_ = auVar3._16_8_;
  backup_cid._48_8_ = auVar3._24_8_;
  backup_cid._0_8_ = auVar2._0_8_;
  backup_cid.cid.cid._0_8_ = auVar2._16_8_;
  if (sequence < retire_prior_to) {
    __assert_fail("sequence >= retire_prior_to",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                  ,0xba,
                  "int quicly_remote_cid_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *, uint64_t, uint64_t *, size_t *)"
                 );
  }
  puVar35 = &set->cids[0].sequence;
  sVar34 = 0xffffffffffffffff;
  sVar33 = 0;
  sVar30 = sVar34;
  for (idx_to_unreg = 0; idx_to_unreg != 4; idx_to_unreg = idx_to_unreg + 1) {
    uVar31 = sVar30;
    if (((quicly_remote_cid_t *)(puVar35 + -1))->is_active != 0) {
      uVar27 = *puVar35;
      if (uVar27 < retire_prior_to) {
        unregistered_seqs[sVar33] = uVar27;
        sVar33 = sVar33 + 1;
        do_unregister(set,idx_to_unreg);
      }
      else {
        if (uVar27 <= sVar30) {
          uVar31 = uVar27;
        }
        if (uVar27 < sVar30) {
          sVar34 = idx_to_unreg;
        }
      }
    }
    puVar35 = puVar35 + 7;
    sVar30 = uVar31;
  }
  if ((set->cids[0].is_active == 0) && (sVar34 != 0xffffffffffffffff)) {
    promote_cid(set,sVar34);
  }
  *num_unregistered_seqs = sVar33;
  iVar29 = 0x20009;
  if (set->_largest_sequence_expected < sequence) {
LAB_00124599:
    if (set->cids[0].is_active == 0) {
      *(undefined8 *)(set->cids[0].cid.cid + 8) = uVar13;
      *(undefined8 *)(set->cids[0].cid.cid + 0x10) = backup_cid._32_8_;
      *(undefined8 *)(set->cids[0].stateless_reset_token + 3) =
           backup_cid.stateless_reset_token._3_8_;
      *(undefined8 *)(set->cids[0].stateless_reset_token + 0xb) = backup_cid._48_8_;
      set->cids[0].is_active = backup_cid.is_active;
      *(undefined4 *)&set->cids[0].field_0x4 = backup_cid._4_4_;
      set->cids[0].sequence = auVar2._8_8_;
      *(undefined8 *)set->cids[0].cid.cid = backup_cid.cid.cid._0_8_;
      *(undefined8 *)(set->cids[0].cid.cid + 8) = uVar13;
    }
  }
  else {
    sVar34 = 0;
    bVar28 = false;
    for (lVar32 = 0; lVar32 != 0xe0; lVar32 = lVar32 + 0x38) {
      if (*(int *)(set->cids[0].cid.cid + lVar32 + -0x10) == 0) {
        if (*(uint64_t *)(set->cids[0].cid.cid + lVar32 + -8) == sequence) {
          if (bVar28) {
            __assert_fail("!was_stored",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                          ,0x60,
                          "int do_register(quicly_remote_cid_set_t *, uint64_t, const uint8_t *, size_t, const uint8_t *)"
                         );
          }
          puVar1 = set->cids[0].cid.cid + lVar32 + -0x10;
          *(uint64_t *)(puVar1 + 8) = sequence;
          memcpy(puVar1 + 0x10,cid,cid_len);
          puVar1[0x24] = (char)cid_len;
          *(undefined1 (*) [16])(puVar1 + 0x25) = *(undefined1 (*) [16])srt;
          puVar1[0] = '\x01';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          bVar28 = true;
          if ((lVar32 != 0) && (set->cids[0].is_active == 0)) {
            promote_cid(set,sVar34);
            bVar28 = true;
          }
        }
      }
      else {
        if ((set->cids[0].cid.cid[lVar32 + 0x14] == cid_len) &&
           (iVar29 = bcmp(set->cids[0].cid.cid + lVar32,cid,cid_len), iVar29 == 0)) {
          iVar29 = 0x2000a;
          if ((*(uint64_t *)(set->cids[0].cid.cid + lVar32 + -8) == sequence) &&
             (*(undefined1 (*) [16])(set->cids[0].stateless_reset_token + lVar32) ==
              *(undefined1 (*) [16])srt)) {
            return 0;
          }
          goto LAB_00124599;
        }
        if (*(uint64_t *)(set->cids[0].cid.cid + lVar32 + -8) == sequence) {
          iVar29 = 0x2000a;
          goto LAB_00124599;
        }
      }
      sVar34 = sVar34 + 1;
    }
    iVar29 = 0;
  }
  return iVar29;
}

Assistant:

int quicly_remote_cid_register(quicly_remote_cid_set_t *set, uint64_t sequence, const uint8_t *cid, size_t cid_len,
                               const uint8_t srt[QUICLY_STATELESS_RESET_TOKEN_LEN], uint64_t retire_prior_to,
                               uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT], size_t *num_unregistered_seqs)
{
    quicly_remote_cid_t backup_cid = set->cids[0]; // preserve one valid entry in cids[0] to handle protocol violation
    int ret;

    assert(sequence >= retire_prior_to);

    /* First, handle retire_prior_to. This order is important as it is possible to receive a NEW_CONNECTION_ID frame such that it
     * retires active_connection_id_limit CIDs and then installs one new CID. */
    *num_unregistered_seqs = unregister_prior_to(set, retire_prior_to, unregistered_seqs);

    /* Then, register given value. */
    if ((ret = do_register(set, sequence, cid, cid_len, srt)) != 0) {
        /* restore the backup and send the error */
        if (!set->cids[0].is_active)
            set->cids[0] = backup_cid;
        return ret;
    }

    return ret;
}